

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV1SceneBlock(Parser *this)

{
  bool bVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  
  iVar4 = 0;
LAB_003cd88f:
  do {
    pbVar2 = (byte *)this->filePtr;
    bVar3 = *pbVar2;
    if (bVar3 == 0x2a) {
      this->filePtr = (char *)(pbVar2 + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_BACKGROUND_STATIC",0x17);
      if (bVar1) {
        ParseLV4MeshFloatTriple(this,&(this->m_clrBackground).r);
        goto LAB_003cd88f;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_AMBIENT_STATIC",0x14);
      if (bVar1) {
        ParseLV4MeshFloatTriple(this,&(this->m_clrAmbient).r);
        goto LAB_003cd88f;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_FIRSTFRAME",0x10);
      if (bVar1) {
        ParseLV4MeshLong(this,&this->iFirstFrame);
        goto LAB_003cd88f;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_LASTFRAME",0xf);
      if (bVar1) {
        ParseLV4MeshLong(this,&this->iLastFrame);
        goto LAB_003cd88f;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_FRAMESPEED",0x10);
      if (bVar1) {
        ParseLV4MeshLong(this,&this->iFrameSpeed);
        goto LAB_003cd88f;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_TICKSPERFRAME",0x13);
      if (bVar1) {
        ParseLV4MeshLong(this,&this->iTicksPerFrame);
        goto LAB_003cd88f;
      }
      pbVar2 = (byte *)this->filePtr;
      bVar3 = *pbVar2;
LAB_003cd99e:
      bVar1 = false;
      if ((bVar3 < 0xe) && ((0x3401U >> (bVar3 & 0x1f) & 1) != 0)) {
        if (this->bLastWasEndLine != false) goto LAB_003cd9bb;
        this->iLineNumber = this->iLineNumber + 1;
        bVar1 = true;
      }
    }
    else {
      if (bVar3 == 0) {
        return;
      }
      if (bVar3 == 0x7b) {
        iVar4 = iVar4 + 1;
      }
      else {
        if (bVar3 != 0x7d) goto LAB_003cd99e;
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          this->filePtr = (char *)(pbVar2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
LAB_003cd9bb:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar2 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV1SceneBlock()
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"SCENE_BACKGROUND_STATIC",23))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrBackground.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_AMBIENT_STATIC",20))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrAmbient.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FIRSTFRAME",16))
            {
                ParseLV4MeshLong(iFirstFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_LASTFRAME",15))
            {
                ParseLV4MeshLong(iLastFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FRAMESPEED",16))
            {
                ParseLV4MeshLong(iFrameSpeed);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_TICKSPERFRAME",19))
            {
                ParseLV4MeshLong(iTicksPerFrame);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}